

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall Camera::Camera(Camera *this)

{
  Image *this_00;
  int local_18 [2];
  
  *(undefined8 *)&(this->position).field_0 = 0;
  *(undefined8 *)((long)&(this->position).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->up).field_0 + 4) = 0x3f800000;
  *(undefined8 *)&(this->lookAt).field_0 = 0;
  (this->lookAt).field_0.field_0.z = -1.0;
  this->fovX = 0.7853982;
  this->fovY = 0.5890486;
  this_00 = (Image *)operator_new(0x10);
  local_18[0] = 600;
  local_18[1] = 800;
  Image::Image(this_00,local_18 + 1,local_18);
  this->outputImage = this_00;
  return;
}

Assistant:

Camera::Camera() {
    position = glm::vec3(0, 0, 0);
    up = glm::vec3(0, 1, 0);
    lookAt = glm::vec3(0, 0, -1);
    fovX = glm::quarter_pi<float>();
    fovY = fovX * 600.0 / 800.0;
    outputImage = new Image(800, 600);
}